

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::Value(Value *this,string *value)

{
  uint length;
  char *pcVar1;
  string *value_local;
  Value *this_local;
  
  initBasic(this,stringValue,true);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  length = std::__cxx11::string::length();
  pcVar1 = duplicateStringValue(pcVar1,length);
  (this->value_).string_ = pcVar1;
  return;
}

Assistant:

Value::Value(const std::string& value) {
  initBasic(stringValue, true);
  value_.string_ =
      duplicateStringValue(value.c_str(), (unsigned int)value.length());
}